

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall
kj::PathPtr::evalWin32(Path *__return_storage_ptr__,PathPtr *this,StringPtr pathText)

{
  size_t sVar1;
  size_t sVar2;
  Vector<kj::String> *this_00;
  ArrayPtr<const_kj::String> *parts;
  size_t extraout_RDX;
  undefined1 in_R9B;
  StringPtr path;
  StringPtr path_00;
  String local_a0;
  String *local_88;
  String *p;
  String *__end1;
  String *local_68;
  String *__begin1;
  ArrayPtr<const_kj::String> *__range1;
  char *pcStack_50;
  undefined1 local_48 [8];
  Vector<kj::String> newParts;
  PathPtr *this_local;
  StringPtr pathText_local;
  
  path.content.ptr = (char *)pathText.content.size_;
  parts = (ArrayPtr<const_kj::String> *)pathText.content.ptr;
  newParts.builder.disposer = (ArrayDisposer *)this;
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  path_00.content.size_ = extraout_RDX;
  path_00.content.ptr = path.content.ptr;
  __range1 = parts;
  pcStack_50 = path.content.ptr;
  sVar2 = Path::countPartsWin32((Path *)parts,path_00);
  Vector<kj::String>::Vector((Vector<kj::String> *)local_48,sVar1 + sVar2);
  __begin1 = (String *)this;
  local_68 = ArrayPtr<const_kj::String>::begin(&this->parts);
  p = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)__begin1);
  for (; local_68 != p; local_68 = local_68 + 1) {
    local_88 = local_68;
    heapString(&local_a0,local_68);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_48,&local_a0);
    String::~String(&local_a0);
  }
  this_00 = mv<kj::Vector<kj::String>>((Vector<kj::String> *)local_48);
  path.content.size_ = 0;
  Path::evalWin32Impl(__return_storage_ptr__,(Path *)this_00,(Vector<kj::String> *)parts,path,
                      (bool)in_R9B);
  Vector<kj::String>::~Vector((Vector<kj::String> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::evalWin32(StringPtr pathText) const {
  Vector<String> newParts(parts.size() + Path::countPartsWin32(pathText));
  for (auto& p: parts) newParts.add(heapString(p));
  return Path::evalWin32Impl(kj::mv(newParts), pathText);
}